

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O1

duckdb_logical_type duckdb_map_type_key_type(duckdb_logical_type type)

{
  LogicalType *this;
  LogicalType *other;
  
  if (((type == (duckdb_logical_type)0x0) || (*type != (_duckdb_logical_type)0x66)) ||
     (*type != (_duckdb_logical_type)0x66)) {
    this = (LogicalType *)0x0;
  }
  else {
    this = (LogicalType *)operator_new(0x18);
    other = duckdb::MapType::KeyType((LogicalType *)type);
    duckdb::LogicalType::LogicalType(this,other);
  }
  return (duckdb_logical_type)this;
}

Assistant:

duckdb_logical_type duckdb_map_type_key_type(duckdb_logical_type type) {
	if (!AssertLogicalTypeId(type, duckdb::LogicalTypeId::MAP)) {
		return nullptr;
	}
	auto &mtype = *(reinterpret_cast<duckdb::LogicalType *>(type));
	if (mtype.id() != duckdb::LogicalTypeId::MAP) {
		return nullptr;
	}
	return reinterpret_cast<duckdb_logical_type>(new duckdb::LogicalType(duckdb::MapType::KeyType(mtype)));
}